

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::FindLoopNestingError(S2Polygon *this,S2Error *error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  S2Loop *pSVar6;
  S2Loop *b;
  char *pcVar7;
  bool local_55;
  uint local_38;
  bool reverse_b;
  bool nested;
  int j;
  int last;
  int i_1;
  int depth;
  int i;
  int last_depth;
  S2Error *error_local;
  S2Polygon *this_local;
  
  depth = -1;
  i_1 = 0;
  while( true ) {
    iVar3 = num_loops(this);
    if (iVar3 <= i_1) {
      j = 0;
      do {
        iVar3 = num_loops(this);
        if (iVar3 <= j) {
          return false;
        }
        iVar3 = GetLastDescendant(this,j);
        for (local_38 = 0; iVar5 = num_loops(this), (int)local_38 < iVar5; local_38 = local_38 + 1)
        {
          if (j != local_38) {
            bVar1 = j + 1 <= (int)local_38;
            local_55 = bVar1 && (int)local_38 <= iVar3;
            pSVar6 = loop(this,j);
            b = loop(this,local_38);
            bVar2 = S2Loop::ContainsNonCrossingBoundary(pSVar6,b,false);
            if (bVar2 != local_55) {
              pcVar7 = "not ";
              if (bVar1 && (int)local_38 <= iVar3) {
                pcVar7 = "";
              }
              S2Error::Init(error,POLYGON_INVALID_LOOP_NESTING,
                            "Invalid nesting: loop %d should %scontain loop %d",(ulong)(uint)j,
                            pcVar7,(ulong)local_38);
              return true;
            }
          }
        }
        j = j + 1;
      } while( true );
    }
    pSVar6 = loop(this,i_1);
    uVar4 = S2Loop::depth(pSVar6);
    if (((int)uVar4 < 0) || (depth + 1 < (int)uVar4)) break;
    i_1 = i_1 + 1;
    depth = uVar4;
  }
  S2Error::Init(error,POLYGON_INVALID_LOOP_DEPTH,"Loop %d: invalid loop depth (%d)",(ulong)(uint)i_1
                ,(ulong)uVar4);
  return true;
}

Assistant:

bool S2Polygon::FindLoopNestingError(S2Error* error) const {
  // First check that the loop depths make sense.
  for (int last_depth = -1, i = 0; i < num_loops(); ++i) {
    int depth = loop(i)->depth();
    if (depth < 0 || depth > last_depth + 1) {
      error->Init(S2Error::POLYGON_INVALID_LOOP_DEPTH,
                  "Loop %d: invalid loop depth (%d)", i, depth);
      return true;
    }
    last_depth = depth;
  }
  // Then check that they correspond to the actual loop nesting.  This test
  // is quadratic in the number of loops but the cost per iteration is small.
  for (int i = 0; i < num_loops(); ++i) {
    int last = GetLastDescendant(i);
    for (int j = 0; j < num_loops(); ++j) {
      if (i == j) continue;
      bool nested = (j >= i + 1) && (j <= last);
      const bool reverse_b = false;
      if (loop(i)->ContainsNonCrossingBoundary(loop(j), reverse_b) != nested) {
        error->Init(S2Error::POLYGON_INVALID_LOOP_NESTING,
                    "Invalid nesting: loop %d should %scontain loop %d",
                    i, nested ? "" : "not ", j);
        return true;
      }
    }
  }
  return false;
}